

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

filtration_entry_t __thiscall
priority_queue_t<std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
::pop_pivot(priority_queue_t<std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
            *this)

{
  bool bVar1;
  bool bVar2;
  const_reference p;
  index_t iVar3;
  index_t iVar4;
  filtration_entry_t fVar5;
  filtration_entry_t local_50;
  entry_t local_40;
  undefined1 local_38 [8];
  filtration_entry_t pivot;
  priority_queue_t<std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
  *this_local;
  long local_10;
  
  remove_trivial_coefficient_entries(this);
  bVar1 = std::
          priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
          ::empty(&this->
                   super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                 );
  if (bVar1) {
    pivot.super_pair<float,_long>.second = -1;
    filtration_entry_t::filtration_entry_t
              ((filtration_entry_t *)&this_local,&pivot.super_pair<float,_long>.second);
  }
  else {
    fVar5 = get_top(this);
    pivot.super_pair<float,_long>._0_8_ = fVar5.super_pair<float,_long>.second;
    local_38._0_4_ = fVar5.super_pair<float,_long>.first;
    safe_pop(this);
    while( true ) {
      bVar2 = std::
              priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
              ::empty(&this->
                       super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                     );
      bVar1 = false;
      if (!bVar2) {
        p = std::
            priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
            ::top(&this->
                   super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                 );
        iVar3 = get_index(p);
        iVar4 = get_index((filtration_entry_t *)local_38);
        bVar1 = iVar3 == iVar4;
      }
      if (!bVar1) {
        this_local = (priority_queue_t<std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                      *)(ulong)(uint)local_38._0_4_;
        local_10 = pivot.super_pair<float,_long>._0_8_;
        goto LAB_001977de;
      }
      safe_pop(this);
      remove_trivial_coefficient_entries(this);
      bVar1 = std::
              priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
              ::empty(&this->
                       super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                     );
      if (bVar1) break;
      fVar5 = get_top(this);
      local_50.super_pair<float,_long>.second = fVar5.super_pair<float,_long>.second;
      local_50.super_pair<float,_long>.first = fVar5.super_pair<float,_long>.first;
      filtration_entry_t::operator=((filtration_entry_t *)local_38,&local_50);
      safe_pop(this);
    }
    local_40 = -1;
    filtration_entry_t::filtration_entry_t((filtration_entry_t *)&this_local,&local_40);
  }
LAB_001977de:
  fVar5.super_pair<float,_long>._0_8_ = (ulong)this_local & 0xffffffff;
  fVar5.super_pair<float,_long>.second = local_10;
  return (filtration_entry_t)fVar5.super_pair<float,_long>;
}

Assistant:

filtration_entry_t pop_pivot() {
		remove_trivial_coefficient_entries();
		if (std::priority_queue<filtration_entry_t, Container, Comparator>::empty())
			return filtration_entry_t(-1);
		else {
			auto pivot = get_top();
			safe_pop();
			while (!std::priority_queue<filtration_entry_t, Container, Comparator>::empty() &&
			       get_index(std::priority_queue<filtration_entry_t, Container, Comparator>::top()) ==
			           get_index(pivot)) {
				safe_pop();
				remove_trivial_coefficient_entries();

				if (std::priority_queue<filtration_entry_t, Container, Comparator>::empty())
					return filtration_entry_t(-1);
				else {
					pivot = get_top();
					safe_pop();
				}
			}
			return pivot;
		}
	}